

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_error.cc
# Opt level: O2

void SM_PrintError(RC rc)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  
  if (rc - 0x12dU < 9) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"SM warning: ");
    pcVar3 = _ZL10SM_WarnMsg_rel + *(int *)(_ZL10SM_WarnMsg_rel + (ulong)(rc - 0x12dU) * 4);
  }
  else {
    if (rc == 0) {
      poVar1 = (ostream *)&std::cerr;
      pcVar3 = "SM_PrintError called with return code of 0\n";
      goto LAB_0011797d;
    }
    if (rc == -0xb) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      poVar1 = (ostream *)&std::cerr;
    }
    else {
      if (rc != -0x12d) {
        poVar1 = std::operator<<((ostream *)&std::cerr,"SM error: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,rc);
        pcVar3 = " is out of bounds\n";
        goto LAB_0011797d;
      }
      poVar1 = std::operator<<((ostream *)&std::cerr,"SM error: ");
      pcVar3 = "Invalid database";
    }
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  pcVar3 = "\n";
LAB_0011797d:
  std::operator<<(poVar1,pcVar3);
  return;
}

Assistant:

void SM_PrintError(RC rc)
{
  // Check the return code is within proper limits
  if (rc >= START_SM_WARN && rc <= SM_LASTWARN)
    // Print warning
    cerr << "SM warning: " << SM_WarnMsg[rc - START_SM_WARN] << "\n";
  // Error codes are negative, so invert everything
  else if (-rc >= -START_SM_ERR && -rc < -SM_LASTERROR)
    // Print error
    cerr << "SM error: " << SM_ErrorMsg[-rc + START_SM_ERR] << "\n";
  else if (rc == PF_UNIX)
#ifdef PC
      cerr << "OS error\n";
#else
      cerr << strerror(errno) << "\n";
#endif
  else if (rc == 0)
    cerr << "SM_PrintError called with return code of 0\n";
  else
    cerr << "SM error: " << rc << " is out of bounds\n";
}